

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  long lVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  byte bVar4;
  uint32_t uVar5;
  byte bVar6;
  byte bVar7;
  nn_trie_node *pnVar8;
  nn_trie nVar9;
  long lVar10;
  nn_trie nVar11;
  undefined4 *puVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  size_t __n;
  byte *pbVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  
  nVar9 = (nn_trie)self->root;
  if (nVar9.root != (nn_trie_node *)0x0) {
LAB_00102675:
    puVar3 = (nVar9.root)->prefix;
    bVar6 = (nVar9.root)->prefix_len;
    uVar13 = 0;
    if (bVar6 != 0) {
      uVar14 = (ulong)(uint)bVar6;
      uVar13 = 0;
      do {
        if (size == uVar13) {
          uVar13 = size & 0xffffffff;
          goto LAB_001026b2;
        }
        if (puVar3[uVar13] != data[uVar13]) goto LAB_001026b2;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
      pbVar16 = data + uVar14;
      lVar17 = size - uVar14;
LAB_001026cd:
      if (size == uVar14) goto LAB_00102786;
      pnVar8 = (nn_trie_node *)nn_node_next(nVar9.root,*pbVar16);
      if ((pnVar8 == (nn_trie_node *)0x0) ||
         (nVar9.root = *(nn_trie_node **)pnVar8, nVar9.root == (nn_trie_node *)0x0))
      goto LAB_00102781;
      data = pbVar16 + 1;
      size = lVar17 - 1;
      self = (nn_trie *)pnVar8;
      goto LAB_00102675;
    }
LAB_001026b2:
    uVar14 = (ulong)(int)uVar13;
    pbVar16 = data + uVar14;
    lVar17 = size - uVar14;
    if ((int)(uint)bVar6 <= (int)uVar13) goto LAB_001026cd;
    nVar11.root = (nn_trie_node *)malloc(0x20);
    *self = (nn_trie)nVar11.root;
    if (nVar11.root == (nn_trie_node *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x123,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    (nVar11.root)->refcount = 0;
    (nVar11.root)->prefix_len = (byte)uVar13;
    (nVar11.root)->type = '\x01';
    memcpy((nVar11.root)->prefix,puVar3,uVar14);
    (self->root->u).sparse.children[0] = (nVar9.root)->prefix[uVar14];
    bVar6 = ~(byte)uVar13 + (nVar9.root)->prefix_len;
    (nVar9.root)->prefix_len = bVar6;
    memmove(puVar3,puVar3 + uVar14 + 1,(ulong)bVar6);
    pnVar8 = nn_node_compact(nVar9.root);
    *(nn_trie_node **)(self->root + 1) = pnVar8;
LAB_00102781:
    if (size == uVar14) goto LAB_00102786;
    nVar9.root = self->root;
    bVar6 = (nVar9.root)->type;
    uVar13 = (ulong)bVar6;
    if (uVar13 < 8) {
      nVar9.root = (nn_trie_node *)realloc(nVar9.root,uVar13 * 8 + 0x20);
      *self = (nn_trie)nVar9.root;
      if (nVar9.root == (nn_trie_node *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x13a,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      bVar6 = (nVar9.root)->type;
      (nVar9.root)->prefix[(ulong)bVar6 + 10] = *pbVar16;
      bVar6 = bVar6 + 1;
      (nVar9.root)->type = bVar6;
      self = (nn_trie *)((nVar9.root)->prefix + (ulong)bVar6 * 8 + 10);
      puVar3 = (nVar9.root)->prefix + (ulong)bVar6 * 8 + 10;
      puVar3[0] = '\0';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      puVar3[4] = '\0';
      puVar3[5] = '\0';
      puVar3[6] = '\0';
      puVar3[7] = '\0';
    }
    else {
      if (bVar6 == 9) {
        bVar6 = *pbVar16;
        bVar7 = ((nVar9.root)->u).sparse.children[0];
        bVar15 = ((nVar9.root)->u).sparse.children[1];
        if ((bVar6 < bVar7) || (bVar15 < bVar6)) {
          uVar19 = (uint)bVar7;
          if (bVar6 <= bVar7) {
            uVar19 = (uint)bVar6;
          }
          uVar18 = (uint)bVar15;
          if (bVar15 <= bVar6) {
            uVar18 = (uint)bVar6;
          }
          nVar9.root = (nn_trie_node *)realloc(nVar9.root,(long)(int)(uVar18 - uVar19) * 8 + 0x20);
          *self = (nn_trie)nVar9.root;
          if (nVar9.root == (nn_trie_node *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                          ,0x14d,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          bVar7 = ((nVar9.root)->u).sparse.children[0];
          lVar10 = (ulong)((nVar9.root)->u).sparse.children[1] - (ulong)bVar7;
          lVar1 = lVar10 + 1;
          if (bVar7 == (byte)uVar19) {
            pnVar8 = (nn_trie_node *)(nVar9.root[1].prefix + (long)(int)lVar1 * 8 + -6);
            lVar10 = (long)(int)((uVar18 - uVar19) - (int)lVar10);
          }
          else {
            lVar10 = (long)(int)(bVar7 - uVar19);
            pnVar8 = nVar9.root + 1;
            memmove(nVar9.root[1].prefix + lVar10 * 8 + -6,pnVar8,lVar1 * 8);
          }
          memset(pnVar8,0,lVar10 << 3);
          ((nVar9.root)->u).sparse.children[0] = (byte)uVar19;
          ((nVar9.root)->u).sparse.children[1] = (uint8_t)uVar18;
        }
        puVar2 = &((nVar9.root)->u).dense.nbr;
        *puVar2 = *puVar2 + 1;
        self = (nn_trie *)
               ((long)self->root +
               ((ulong)bVar6 - (ulong)(self->root->u).sparse.children[0]) * 8 + 0x18);
      }
      else {
        bVar7 = 0xff;
        uVar14 = 0;
        bVar15 = 0;
        do {
          bVar4 = (nVar9.root)->prefix[uVar14 + 10];
          if (bVar4 <= bVar7) {
            bVar7 = bVar4;
          }
          if (bVar4 < bVar15) {
            bVar4 = bVar15;
          }
          bVar15 = bVar4;
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
        bVar4 = *pbVar16;
        if (bVar4 <= bVar7) {
          bVar7 = bVar4;
        }
        if (bVar4 < bVar15) {
          bVar4 = bVar15;
        }
        nVar11.root = (nn_trie_node *)malloc((long)(int)((uint)bVar4 - (uint)bVar7) * 8 + 0x20);
        *self = (nn_trie)nVar11.root;
        if (nVar11.root == (nn_trie_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                        ,0x17b,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        (nVar11.root)->refcount = 0;
        bVar15 = (nVar9.root)->prefix_len;
        (nVar11.root)->prefix_len = bVar15;
        (nVar11.root)->type = '\t';
        memcpy((nVar11.root)->prefix,(nVar9.root)->prefix,(ulong)bVar15);
        ((nVar11.root)->u).sparse.children[0] = bVar7;
        ((nVar11.root)->u).sparse.children[1] = bVar4;
        ((nVar11.root)->u).dense.nbr = bVar6 + 1;
        uVar14 = 0;
        memset(nVar11.root + 1,0,(long)(int)((uint)bVar4 - (uint)bVar7) * 8 + 8);
        do {
          *(undefined8 *)
           ((long)self->root + ((ulong)(nVar9.root)->prefix[uVar14 + 10] - (ulong)bVar7) * 8 + 0x18)
               = *(undefined8 *)(nVar9.root[1].prefix + uVar14 * 8 + -6);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
        self = (nn_trie *)nn_node_next(self->root,*pbVar16);
        free(nVar9.root);
      }
      lVar1._0_4_ = ((nn_trie_node *)self)->refcount;
      lVar1._4_1_ = ((nn_trie_node *)self)->type;
      lVar1._5_1_ = ((nn_trie_node *)self)->prefix_len;
      lVar1._6_1_ = ((nn_trie_node *)self)->prefix[0];
      lVar1._7_1_ = ((nn_trie_node *)self)->prefix[1];
      if (lVar1 != 0) {
        __assert_fail("!*node",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x195,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
    }
    data = pbVar16 + 1;
    size = lVar17 - 1;
  }
  uVar13 = (ulong)(10 < size);
  puVar12 = (undefined4 *)malloc(uVar13 * 8 + 0x18);
  *self = (nn_trie)puVar12;
  while( true ) {
    if (puVar12 == (undefined4 *)0x0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                    ,0x19c,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
    }
    *puVar12 = 0;
    *(char *)(puVar12 + 1) = (char)uVar13;
    __n = 10;
    if (size < 10) {
      __n = size;
    }
    *(char *)((long)puVar12 + 5) = (char)__n;
    memcpy((void *)((long)puVar12 + 6),data,__n);
    if ((char)uVar13 == '\0') break;
    uVar13 = (ulong)self->root->prefix_len;
    pbVar16 = data + uVar13;
    data = pbVar16 + 1;
    (self->root->u).sparse.children[0] = *pbVar16;
    pnVar8 = self->root;
    self = (nn_trie *)(pnVar8 + 1);
    size = size + ~uVar13;
    uVar13 = (ulong)(10 < size);
    puVar12 = (undefined4 *)malloc(uVar13 * 8 + 0x18);
    *(undefined4 **)(pnVar8 + 1) = puVar12;
  }
LAB_00102786:
  uVar5 = self->root->refcount;
  self->root->refcount = uVar5 + 1;
  return (int)(uVar5 == 0);
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}